

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS
ref_edge_rcm_queue(REF_EDGE ref_edge,REF_INT node,REF_INT *o2n,REF_INT *n2o,REF_INT *ndone,
                  REF_INT *queue,REF_INT *nqueue)

{
  int iVar1;
  int node_00;
  REF_ADJ ref_adj;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_INT *pRVar4;
  undefined8 uVar5;
  long lVar6;
  REF_INT degree;
  REF_INT nhere;
  REF_INT local_48 [2];
  REF_EDGE local_40;
  REF_INT *local_38;
  
  ref_adj = ref_edge->adj;
  n2o[*ndone] = node;
  iVar1 = *ndone;
  o2n[node] = iVar1;
  *ndone = iVar1 + 1;
  local_48[1] = 0;
  if (((node < 0) || (ref_adj->nnode <= node)) || (lVar6 = (long)ref_adj->first[node], lVar6 == -1))
  {
    return 0;
  }
  pRVar2 = ref_adj->item + lVar6;
  local_40 = ref_edge;
  local_38 = queue;
  do {
    iVar1 = pRVar2->ref;
    pRVar4 = ref_edge->e2n;
    node_00 = pRVar4[(long)iVar1 * 2];
    if (o2n[node_00] == -1) {
      o2n[node_00] = -2;
      uVar3 = ref_adj_degree(ref_adj,node_00,local_48);
      if (uVar3 != 0) {
        uVar5 = 0x302;
        goto LAB_0011542d;
      }
      ref_edge_rcm_queue_node(node_00,local_48[0],local_38,nqueue,local_48 + 1);
      pRVar4 = local_40->e2n;
      ref_edge = local_40;
    }
    iVar1 = pRVar4[(int)(iVar1 * 2 | 1)];
    if (o2n[iVar1] == -1) {
      o2n[iVar1] = -2;
      uVar3 = ref_adj_degree(ref_adj,iVar1,local_48);
      if (uVar3 != 0) {
        uVar5 = 0x309;
LAB_0011542d:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               uVar5,"ref_edge_rcm_queue",(ulong)uVar3,"deg");
        return uVar3;
      }
      ref_edge_rcm_queue_node(iVar1,local_48[0],local_38,nqueue,local_48 + 1);
      ref_edge = local_40;
    }
    lVar6 = (long)ref_adj->item[(int)lVar6].next;
    if (lVar6 == -1) {
      return 0;
    }
    pRVar2 = ref_adj->item + lVar6;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_edge_rcm_queue(REF_EDGE ref_edge, REF_INT node,
                                             REF_INT *o2n, REF_INT *n2o,
                                             REF_INT *ndone, REF_INT *queue,
                                             REF_INT *nqueue) {
  REF_ADJ ref_adj = ref_edge_adj(ref_edge);
  REF_INT item, ref, other, degree;
  REF_INT nhere;
  n2o[(*ndone)] = node;
  o2n[node] = (*ndone);
  (*ndone)++;
  nhere = 0;

  /* printf("%d done %d nq %d\n", *ndone, node, *nqueue); */

  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    other = ref_edge_e2n(ref_edge, 0, ref);
    if (REF_EMPTY == o2n[other]) {
      o2n[other] = -2; /* mark as queued */
      RSS(ref_adj_degree(ref_adj, other, &degree), "deg");
      RSS(ref_edge_rcm_queue_node(other, degree, queue, nqueue, &nhere),
          "queue n0");
    }
    other = ref_edge_e2n(ref_edge, 1, ref);
    if (REF_EMPTY == o2n[other]) {
      o2n[other] = -2; /* mark as queued */
      RSS(ref_adj_degree(ref_adj, other, &degree), "deg");
      RSS(ref_edge_rcm_queue_node(other, degree, queue, nqueue, &nhere),
          "queue n1");
    }
  }

  return REF_SUCCESS;
}